

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O1

void HydroUtils::EB_ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Array4<const_double> *apx,Array4<const_double> *apy,Array4<const_double> *apz,
               Geometry *geom,int ncomp,Array4<const_amrex::EBCellFlag> *flag,
               bool fluxes_are_area_weighted)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  EBCellFlag *pEVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint32_t *puVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  double *pdVar42;
  int iVar43;
  double *pdVar44;
  long lVar45;
  bool bVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double *local_148;
  double *local_140;
  
  if (fluxes_are_area_weighted) {
    dVar47 = (geom->super_CoordSys).dx[0];
    dVar50 = (geom->super_CoordSys).dx[1];
    dVar48 = (geom->super_CoordSys).dx[2];
    dVar49 = dVar50 * dVar48;
    dVar48 = dVar48 * dVar47;
    dVar47 = dVar47 * dVar50;
  }
  else {
    dVar49 = 1.0;
    dVar48 = 1.0;
    dVar47 = 1.0;
  }
  uVar1 = (bx->btype).itype;
  pEVar14 = flag->p;
  lVar15 = flag->jstride;
  lVar16 = flag->kstride;
  lVar33 = (long)(flag->begin).x;
  lVar34 = (long)(flag->begin).y;
  lVar30 = (long)(flag->begin).z;
  uVar31 = (ulong)(uint)ncomp;
  if (0 < ncomp) {
    lVar17 = fx->jstride;
    lVar18 = umac->jstride;
    lVar19 = apx->jstride;
    iVar32 = (apx->begin).y;
    iVar2 = (apx->begin).x;
    iVar3 = (bx->smallend).vect[1];
    lVar45 = (long)iVar3;
    iVar4 = (bx->smallend).vect[0];
    lVar38 = (long)iVar4;
    iVar5 = (umac->begin).y;
    iVar6 = (umac->begin).x;
    lVar20 = xed->jstride;
    local_140 = fx->p + (((lVar45 - (fx->begin).y) * lVar17 + lVar38) - (long)(fx->begin).x);
    pdVar21 = umac->p;
    lVar22 = fx->kstride;
    lVar23 = fx->nstride;
    iVar7 = (fx->begin).z;
    lVar24 = umac->kstride;
    iVar8 = (umac->begin).z;
    iVar43 = (~uVar1 & 1) + (bx->bigend).vect[0];
    local_148 = xed->p + (((lVar45 - (xed->begin).y) * lVar20 + lVar38) - (long)(xed->begin).x);
    lVar25 = xed->kstride;
    lVar26 = xed->nstride;
    iVar9 = (xed->begin).z;
    pdVar27 = apx->p;
    lVar28 = apx->kstride;
    iVar10 = (apx->begin).z;
    iVar11 = (bx->smallend).vect[2];
    iVar12 = (bx->bigend).vect[2];
    iVar13 = (bx->bigend).vect[1];
    uVar40 = 0;
    do {
      iVar29 = iVar11;
      if (iVar11 <= iVar12) {
        do {
          if (iVar3 <= iVar13) {
            lVar35 = (long)iVar29;
            pdVar44 = (double *)((lVar35 - iVar7) * lVar22 * 8 + (long)local_140);
            lVar39 = (long)pdVar27 +
                     (lVar35 - iVar10) * lVar28 * 8 +
                     lVar38 * 8 + (lVar45 - iVar32) * lVar19 * 8 + (long)iVar2 * -8;
            lVar41 = (long)pdVar21 +
                     (lVar35 - iVar8) * lVar24 * 8 +
                     lVar38 * 8 + (lVar45 - iVar5) * lVar18 * 8 + (long)iVar6 * -8;
            pdVar42 = (double *)((lVar35 - iVar9) * lVar25 * 8 + (long)local_148);
            puVar36 = (uint32_t *)
                      ((long)&pEVar14[((lVar45 - lVar34) * lVar15 + lVar38) - lVar33].flag +
                      (lVar35 - lVar30) * lVar16 * 4);
            lVar35 = lVar45;
            do {
              if (iVar4 <= iVar43) {
                lVar37 = 0;
                do {
                  dVar50 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar37 * 4 + 2) & 2) != 0) {
                    dVar50 = pdVar42[lVar37] * *(double *)(lVar41 + lVar37 * 8) *
                             *(double *)(lVar39 + lVar37 * 8) * dVar49;
                  }
                  pdVar44[lVar37] = dVar50;
                  lVar37 = lVar37 + 1;
                } while ((iVar43 - iVar4) + 1 != (int)lVar37);
              }
              lVar35 = lVar35 + 1;
              pdVar44 = pdVar44 + lVar17;
              lVar39 = lVar39 + lVar19 * 8;
              lVar41 = lVar41 + lVar18 * 8;
              pdVar42 = pdVar42 + lVar20;
              puVar36 = puVar36 + lVar15;
            } while (iVar13 + 1 != (int)lVar35);
          }
          bVar46 = iVar29 != iVar12;
          iVar29 = iVar29 + 1;
        } while (bVar46);
      }
      uVar40 = uVar40 + 1;
      local_140 = local_140 + lVar23;
      local_148 = local_148 + lVar26;
    } while (uVar40 != uVar31);
  }
  if (0 < ncomp) {
    lVar17 = fy->jstride;
    lVar18 = vmac->jstride;
    lVar19 = apy->jstride;
    iVar32 = (apy->begin).y;
    iVar2 = (apy->begin).x;
    iVar43 = (bx->bigend).vect[1] + (uint)((uVar1 & 2) == 0);
    iVar3 = (bx->smallend).vect[1];
    lVar38 = (long)iVar3;
    iVar4 = (bx->smallend).vect[0];
    lVar45 = (long)iVar4;
    iVar5 = (vmac->begin).y;
    iVar6 = (vmac->begin).x;
    lVar20 = yed->jstride;
    local_140 = fy->p + (((lVar38 - (fy->begin).y) * lVar17 + lVar45) - (long)(fy->begin).x);
    lVar22 = fy->kstride;
    lVar23 = fy->nstride;
    iVar7 = (fy->begin).z;
    pdVar21 = vmac->p;
    lVar24 = vmac->kstride;
    iVar8 = (vmac->begin).z;
    local_148 = yed->p + (((lVar38 - (yed->begin).y) * lVar20 + lVar45) - (long)(yed->begin).x);
    lVar25 = yed->kstride;
    lVar26 = yed->nstride;
    iVar9 = (yed->begin).z;
    pdVar27 = apy->p;
    lVar28 = apy->kstride;
    iVar10 = (apy->begin).z;
    iVar11 = (bx->bigend).vect[0];
    iVar12 = (bx->smallend).vect[2];
    iVar13 = (bx->bigend).vect[2];
    uVar40 = 0;
    do {
      iVar29 = iVar12;
      if (iVar12 <= iVar13) {
        do {
          if (iVar3 <= iVar43) {
            lVar35 = (long)iVar29;
            pdVar42 = (double *)((lVar35 - iVar7) * lVar22 * 8 + (long)local_140);
            lVar39 = (long)pdVar27 +
                     (lVar35 - iVar10) * lVar28 * 8 +
                     lVar45 * 8 + (lVar38 - iVar32) * lVar19 * 8 + (long)iVar2 * -8;
            lVar41 = (long)pdVar21 +
                     (lVar35 - iVar8) * lVar24 * 8 +
                     lVar45 * 8 + (lVar38 - iVar5) * lVar18 * 8 + (long)iVar6 * -8;
            pdVar44 = (double *)((lVar35 - iVar9) * lVar25 * 8 + (long)local_148);
            puVar36 = (uint32_t *)
                      ((long)&pEVar14[((lVar38 - lVar34) * lVar15 + lVar45) - lVar33].flag +
                      (lVar35 - lVar30) * lVar16 * 4);
            lVar35 = lVar38;
            do {
              if (iVar4 <= iVar11) {
                lVar37 = 0;
                do {
                  dVar50 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar37 * 4 + 1) & 0x80) != 0) {
                    dVar50 = pdVar44[lVar37] * *(double *)(lVar41 + lVar37 * 8) *
                             *(double *)(lVar39 + lVar37 * 8) * dVar48;
                  }
                  pdVar42[lVar37] = dVar50;
                  lVar37 = lVar37 + 1;
                } while ((iVar11 - iVar4) + 1 != (int)lVar37);
              }
              lVar35 = lVar35 + 1;
              pdVar42 = pdVar42 + lVar17;
              lVar39 = lVar39 + lVar19 * 8;
              lVar41 = lVar41 + lVar18 * 8;
              pdVar44 = pdVar44 + lVar20;
              puVar36 = puVar36 + lVar15;
            } while (iVar43 + 1 != (int)lVar35);
          }
          bVar46 = iVar29 != iVar13;
          iVar29 = iVar29 + 1;
        } while (bVar46);
      }
      uVar40 = uVar40 + 1;
      local_140 = local_140 + lVar23;
      local_148 = local_148 + lVar26;
    } while (uVar40 != uVar31);
  }
  iVar32 = (bx->bigend).vect[2] + (uint)((uVar1 & 4) == 0);
  if (0 < ncomp) {
    lVar17 = fz->jstride;
    lVar18 = apz->jstride;
    iVar2 = (apz->begin).y;
    iVar3 = (apz->begin).x;
    iVar4 = (bx->smallend).vect[1];
    lVar45 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar38 = (long)iVar5;
    iVar6 = (wmac->begin).y;
    lVar19 = wmac->jstride;
    iVar7 = (wmac->begin).x;
    lVar20 = zed->jstride;
    local_140 = fz->p + (((lVar45 - (fz->begin).y) * lVar17 + lVar38) - (long)(fz->begin).x);
    lVar22 = fz->kstride;
    lVar23 = fz->nstride;
    iVar8 = (fz->begin).z;
    pdVar21 = wmac->p;
    lVar24 = wmac->kstride;
    iVar9 = (wmac->begin).z;
    pdVar27 = apz->p;
    local_148 = zed->p + (((lVar45 - (zed->begin).y) * lVar20 + lVar38) - (long)(zed->begin).x);
    lVar25 = zed->kstride;
    lVar26 = zed->nstride;
    iVar10 = (zed->begin).z;
    lVar28 = apz->kstride;
    iVar11 = (apz->begin).z;
    iVar12 = (bx->smallend).vect[2];
    iVar13 = (bx->bigend).vect[0];
    iVar43 = (bx->bigend).vect[1];
    uVar40 = 0;
    do {
      iVar29 = iVar12;
      if (iVar12 <= iVar32) {
        do {
          if (iVar4 <= iVar43) {
            lVar35 = (long)iVar29;
            pdVar42 = (double *)((lVar35 - iVar8) * lVar22 * 8 + (long)local_140);
            lVar41 = (long)pdVar27 +
                     (lVar35 - iVar11) * lVar28 * 8 +
                     lVar38 * 8 + (lVar45 - iVar2) * lVar18 * 8 + (long)iVar3 * -8;
            lVar39 = (long)pdVar21 +
                     (lVar35 - iVar9) * lVar24 * 8 +
                     lVar38 * 8 + (lVar45 - iVar6) * lVar19 * 8 + (long)iVar7 * -8;
            pdVar44 = (double *)((lVar35 - iVar10) * lVar25 * 8 + (long)local_148);
            puVar36 = (uint32_t *)
                      ((long)&pEVar14[((lVar45 - lVar34) * lVar15 + lVar38) - lVar33].flag +
                      (lVar35 - lVar30) * lVar16 * 4);
            lVar35 = lVar45;
            do {
              if (iVar5 <= iVar13) {
                lVar37 = 0;
                do {
                  dVar50 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar37 * 4 + 1) & 2) != 0) {
                    dVar50 = pdVar44[lVar37] * *(double *)(lVar39 + lVar37 * 8) *
                             *(double *)(lVar41 + lVar37 * 8) * dVar47;
                  }
                  pdVar42[lVar37] = dVar50;
                  lVar37 = lVar37 + 1;
                } while ((iVar13 - iVar5) + 1 != (int)lVar37);
              }
              lVar35 = lVar35 + 1;
              pdVar42 = pdVar42 + lVar17;
              lVar41 = lVar41 + lVar18 * 8;
              lVar39 = lVar39 + lVar19 * 8;
              pdVar44 = pdVar44 + lVar20;
              puVar36 = puVar36 + lVar15;
            } while (iVar43 + 1 != (int)lVar35);
          }
          bVar46 = iVar29 != iVar32;
          iVar29 = iVar29 + 1;
        } while (bVar46);
      }
      uVar40 = uVar40 + 1;
      local_140 = local_140 + lVar23;
      local_148 = local_148 + lVar26;
    } while (uVar40 != uVar31);
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeFluxes ( Box const& bx,
                               AMREX_D_DECL( Array4<Real> const& fx,
                                             Array4<Real> const& fy,
                                             Array4<Real> const& fz),
                               AMREX_D_DECL( Array4<Real const> const& umac,
                                             Array4<Real const> const& vmac,
                                             Array4<Real const> const& wmac),
                               AMREX_D_DECL( Array4<Real const> const& xed,
                                             Array4<Real const> const& yed,
                                             Array4<Real const> const& zed),
                               AMREX_D_DECL( Array4<Real const> const& apx,
                                             Array4<Real const> const& apy,
                                             Array4<Real const> const& apz),
                               Geometry const& geom, const int ncomp,
                               Array4<EBCellFlag const> const& flag,
                               const bool fluxes_are_area_weighted )
{

    const auto dx = geom.CellSizeArray();

    GpuArray<Real,AMREX_SPACEDIM> area;

#if ( AMREX_SPACEDIM == 3 )
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1]*dx[2];
        area[1] = dx[0]*dx[2];
        area[2] = dx[0]*dx[1];
    } else {
        area[0] = 1.; area[1] = 1.; area[2] = 1.;
    }
#else
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1];
        area[1] = dx[0];
    } else {
        area[0] = 1.; area[1] = 1.;
    }
#endif

    //
    //  X flux
    //
    const Box& xbx = amrex::surroundingNodes(bx,0);

    amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area, apx, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(-1,0,0))
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * apx(i,j,k) * area[0];
        else
            fx(i,j,k,n) = 0.;
    });

    //
    //  y flux
    //
    const Box& ybx = amrex::surroundingNodes(bx,1);

    amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area, apy, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,-1,0))
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * apy(i,j,k) * area[1];
        else
            fy(i,j,k,n) = 0.;
    });

#if (AMREX_SPACEDIM==3)
    //
    //  z flux
    //
    const Box& zbx = amrex::surroundingNodes(bx,2);

    amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area, apz, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,0,-1))
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * apz(i,j,k) * area[2];
        else
            fz(i,j,k,n) = 0.;
    });
#endif

}